

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cpp
# Opt level: O1

void flatbuffers::tests::anon_unknown_1::NumericUtilsTestFloat<float>(char *lower,char *upper)

{
  bool bVar1;
  bool expval;
  float fVar2;
  float fVar3;
  char *end;
  char *local_38;
  
  local_38 = "";
  strtof_l("",&local_38,ClassicLocale::instance_);
  if (local_38 == "") {
    bVar1 = false;
  }
  else {
    bVar1 = *local_38 == '\0';
  }
  expval = false;
  TestEq<bool,bool>(bVar1,false,"\'flatbuffers::StringToNumber(\"\", &f)\' != \'false\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x1b,"");
  local_38 = "1q";
  fVar2 = strtof_l("1q",&local_38,ClassicLocale::instance_);
  if (local_38 != "1q") {
    expval = *local_38 == '\0';
  }
  fVar3 = 0.0;
  if ((expval != false) && (fVar3 = fVar2, NAN(fVar2))) {
    fVar3 = NAN;
  }
  TestEq<bool,bool>(expval,false,"\'flatbuffers::StringToNumber(\"1q\", &f)\' != \'false\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x1c,"");
  TestEq<float,int>(fVar3,0,"\'f\' != \'0\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x1d,"");
  if (upper != (char *)0x0) {
    local_38 = upper;
    fVar2 = strtof_l(upper,&local_38,ClassicLocale::instance_);
    if (local_38 == upper) {
      bVar1 = false;
    }
    else {
      bVar1 = *local_38 == '\0';
    }
    fVar3 = 0.0;
    if ((bVar1 != false) && (fVar3 = fVar2, NAN(fVar2))) {
      fVar3 = NAN;
    }
    TestEq<bool,bool>(bVar1,true,"\'flatbuffers::StringToNumber(upper, &f)\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                      ,0x1e,"");
    TestEq<float,float>(fVar3,INFINITY,"\'f\' != \'+flatbuffers::numeric_limits<T>::infinity()\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                        ,0x1f,"");
    if (lower != (char *)0x0) {
      local_38 = lower;
      fVar2 = strtof_l(lower,&local_38,ClassicLocale::instance_);
      if (local_38 == lower) {
        bVar1 = false;
      }
      else {
        bVar1 = *local_38 == '\0';
      }
      fVar3 = 0.0;
      if ((bVar1 != false) && (fVar3 = fVar2, NAN(fVar2))) {
        fVar3 = NAN;
      }
      TestEq<bool,bool>(bVar1,true,"\'flatbuffers::StringToNumber(lower, &f)\' != \'true\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                        ,0x20,"");
      TestEq<float,float>(fVar3,-INFINITY,"\'f\' != \'-flatbuffers::numeric_limits<T>::infinity()\'"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                          ,0x21,"");
      return;
    }
  }
  __assert_fail("str && val",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                ,0x138,"bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = float]");
}

Assistant:

void NumericUtilsTestFloat(const char *lower, const char *upper) {
  T f;
  TEST_EQ(flatbuffers::StringToNumber("", &f), false);
  TEST_EQ(flatbuffers::StringToNumber("1q", &f), false);
  TEST_EQ(f, 0);
  TEST_EQ(flatbuffers::StringToNumber(upper, &f), true);
  TEST_EQ(f, +flatbuffers::numeric_limits<T>::infinity());
  TEST_EQ(flatbuffers::StringToNumber(lower, &f), true);
  TEST_EQ(f, -flatbuffers::numeric_limits<T>::infinity());
}